

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O2

char * luaT_objtypename(lua_State *L,TValue *o)

{
  byte bVar1;
  TString *key;
  TValue *pTVar2;
  char **ppcVar3;
  Table *t;
  
  bVar1 = o->tt_;
  if (bVar1 == 0x47) {
    t = *(Table **)((o->value_).f + 0x18);
    if (t == (Table *)0x0) {
      bVar1 = 0x47;
    }
    else {
LAB_0011a83e:
      key = luaS_new(L,"__name");
      pTVar2 = luaH_Hgetshortstr(t,key);
      if ((pTVar2->tt_ & 0xf) == 4) {
        ppcVar3 = (char **)((pTVar2->value_).f + 0x18);
        if (-1 < (char)(pTVar2->value_).f[0xb]) {
          return (char *)ppcVar3;
        }
        goto LAB_0011a88a;
      }
      bVar1 = o->tt_;
    }
  }
  else if (bVar1 == 0x45) {
    t = *(Table **)((o->value_).f + 0x20);
    if (t != (Table *)0x0) goto LAB_0011a83e;
    bVar1 = 0x45;
  }
  ppcVar3 = luaT_typenames_ + (ulong)(bVar1 & 0xf) + 1;
LAB_0011a88a:
  return *ppcVar3;
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_Hgetshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttype(o));  /* else use standard type name */
}